

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::SetPixel(Image *image,uint32_t x,uint32_t y,uint8_t value)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  uint8_t in_CL;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  ImageManager manager;
  SetPixelForm1 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  SetPixelForm1 func;
  ImageTypeManager *registrator;
  undefined7 in_stack_fffffffffffffef8;
  uint8_t in_stack_fffffffffffffeff;
  ImageTypeManager *in_stack_ffffffffffffff00;
  ImageManager *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  ImageTypeManager *in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  undefined1 local_50 [24];
  undefined1 *local_38;
  uint8_t local_29;
  SetPixelForm1 local_28;
  ImageTypeManager *local_20;
  undefined7 in_stack_ffffffffffffffe8;
  
  this = ImageTypeManager::instance();
  local_20 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  local_28 = pFVar2->SetPixel;
  local_29 = PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RDI);
  if ((local_28 == (SetPixelForm1)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_20), bVar1)) {
    ImageTypeManager::imageTypes
              ((ImageTypeManager *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    local_38 = local_50;
    local_58._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_ffffffffffffff00,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      if (!bVar1) break;
      in_stack_ffffffffffffff00 = local_20;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_58);
      pFVar2 = ImageTypeManager::functionTable(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
      if (pFVar2->SetPixel != (SetPixelForm1)0x0) {
        local_28 = pFVar2->SetPixel;
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_58);
        local_29 = *puVar3;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_58);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_char)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_uchar *)CONCAT44(in_ESI,in_EDX),
             (char *)CONCAT17(in_CL,in_stack_ffffffffffffffe8));
  anon_unknown.dwarf_9a3be::ImageManager::ImageManager
            ((ImageManager *)in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
  (*local_28)(in_RDI,in_ESI,in_EDX,in_CL);
  anon_unknown.dwarf_9a3be::ImageManager::~ImageManager(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void SetPixel( Image & image, uint32_t x, uint32_t y, uint8_t value )
    {
        initialize( image, SetPixel )
        func( image, x, y, value );
    }